

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::FileOptions::SharedDtor(MessageLite *self)

{
  FeatureSet *this;
  Arena *pAVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  FileOptions *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (FileOptions *)self;
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
  pAVar1 = MessageLite::GetArena(local_18);
  if (pAVar1 == (Arena *)0x0) {
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&local_18[4]._internal_metadata_);
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(local_18 + 5));
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&local_18[5]._internal_metadata_);
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(local_18 + 6));
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&local_18[6]._internal_metadata_);
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(local_18 + 7));
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&local_18[7]._internal_metadata_);
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(local_18 + 8));
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&local_18[8]._internal_metadata_);
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(local_18 + 9));
    this = (FeatureSet *)local_18[9]._internal_metadata_.ptr_;
    if (this != (FeatureSet *)0x0) {
      FeatureSet::~FeatureSet(this);
      operator_delete(this,0x50);
    }
    Impl_::~Impl_((Impl_ *)(local_18 + 1));
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
             ,0x1f92,"this_.GetArena() == nullptr");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline void FileOptions::SharedDtor(MessageLite& self) {
  FileOptions& this_ = static_cast<FileOptions&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.java_package_.Destroy();
  this_._impl_.java_outer_classname_.Destroy();
  this_._impl_.go_package_.Destroy();
  this_._impl_.objc_class_prefix_.Destroy();
  this_._impl_.csharp_namespace_.Destroy();
  this_._impl_.swift_prefix_.Destroy();
  this_._impl_.php_class_prefix_.Destroy();
  this_._impl_.php_namespace_.Destroy();
  this_._impl_.php_metadata_namespace_.Destroy();
  this_._impl_.ruby_package_.Destroy();
  delete this_._impl_.features_;
  this_._impl_.~Impl_();
}